

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O3

Ptr __thiscall soul::SourceCodeText::createForFile(SourceCodeText *this,string *file,string *text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SourceCodeText *this_00;
  string local_68;
  string local_48;
  
  this_00 = (SourceCodeText *)operator_new(0x58);
  local_48._M_dataplus._M_p = (file->_M_dataplus)._M_p;
  paVar1 = &file->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar1) {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)((long)&file->field_2 + 8);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_48._M_string_length = file->_M_string_length;
  (file->_M_dataplus)._M_p = (pointer)paVar1;
  file->_M_string_length = 0;
  (file->field_2)._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (text->_M_dataplus)._M_p;
  paVar1 = &text->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&text->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68._M_string_length = text->_M_string_length;
  (text->_M_dataplus)._M_p = (pointer)paVar1;
  text->_M_string_length = 0;
  (text->field_2)._M_local_buf[0] = '\0';
  SourceCodeText(this_00,&local_48,&local_68,false);
  (this_00->super_RefCountedObject).refCount = (this_00->super_RefCountedObject).refCount + 1;
  *(SourceCodeText **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return (Ptr)this;
}

Assistant:

SourceCodeText::Ptr SourceCodeText::createForFile (std::string file, std::string text)
{
    return Ptr (*new SourceCodeText (std::move (file), std::move (text), false));
}